

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufdwatch.c
# Opt level: O2

void fd_watch_thread_func(_AL_THREAD *self,void *unused)

{
  int iVar1;
  _Bool _Var2;
  uint __i;
  int iVar3;
  long lVar4;
  int *piVar5;
  uint i;
  uint idx;
  ulong uVar6;
  timeval tv;
  fd_set rfds;
  
  while( true ) {
    _Var2 = _al_get_thread_should_stop(self);
    if (_Var2) break;
    _al_mutex_lock(&fd_watch_mutex);
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      rfds.__fds_bits[lVar4] = 0;
    }
    uVar6 = 0;
    iVar3 = -1;
    while( true ) {
      if (fd_watch_list._size <= uVar6) break;
      piVar5 = (int *)_al_vector_ref(&fd_watch_list,(uint)uVar6);
      iVar1 = *piVar5;
      rfds.__fds_bits[iVar1 / 0x40] = rfds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      uVar6 = (ulong)((uint)uVar6 + 1);
    }
    _al_mutex_unlock(&fd_watch_mutex);
    tv.tv_sec = 0;
    tv.tv_usec = 250000;
    iVar3 = select(iVar3 + 1,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    if (0 < iVar3) {
      _al_mutex_lock(&fd_watch_mutex);
      for (idx = 0; idx < fd_watch_list._size; idx = idx + 1) {
        piVar5 = (int *)_al_vector_ref(&fd_watch_list,idx);
        if (((ulong)rfds.__fds_bits[*piVar5 / 0x40] >> ((long)*piVar5 % 0x40 & 0x3fU) & 1) != 0) {
          (**(code **)(piVar5 + 2))(*(undefined8 *)(piVar5 + 4));
        }
      }
      _al_mutex_unlock(&fd_watch_mutex);
    }
  }
  return;
}

Assistant:

static void fd_watch_thread_func(_AL_THREAD *self, void *unused)
{
   (void)unused;

   while (!_al_get_thread_should_stop(self)) {

      fd_set rfds;
      int max_fd;

      /* set up max_fd and rfds */
      _al_mutex_lock(&fd_watch_mutex);
      {
         WATCH_ITEM *wi;
         unsigned int i;

         FD_ZERO(&rfds);
         max_fd = -1;

         for (i = 0; i < _al_vector_size(&fd_watch_list); i++) {
            wi = _al_vector_ref(&fd_watch_list, i);
            FD_SET(wi->fd, &rfds);
            if (wi->fd > max_fd)
               max_fd = wi->fd;
         }
      }
      _al_mutex_unlock(&fd_watch_mutex);

      /* wait for something to happen on one of the fds */
      {
         struct timeval tv;
         int retval;

         tv.tv_sec = 0;
         tv.tv_usec = 250000;

         retval = select(max_fd+1, &rfds, NULL, NULL, &tv);
         if (retval < 1)
            continue;
      }

      /* one or more of the fds has activity */
      _al_mutex_lock(&fd_watch_mutex);
      {
         WATCH_ITEM *wi;
         unsigned int i;

         for (i = 0; i < _al_vector_size(&fd_watch_list); i++) {
            wi = _al_vector_ref(&fd_watch_list, i);
            if (FD_ISSET(wi->fd, &rfds)) {
               /* The callback is allowed to modify the watch list so the mutex
                * must be recursive.
                */
               wi->callback(wi->cb_data);
            }
         }
      }
      _al_mutex_unlock(&fd_watch_mutex);
   }
}